

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_238a35::SndioPlayback::mixerProc(SndioPlayback *this)

{
  bool bVar1;
  int iVar2;
  long in_RDI;
  size_t wrote;
  size_t len;
  byte *WritePtr;
  size_t frameSize;
  size_t frameStep;
  sio_par par;
  size_t in_stack_000000a8;
  ALuint in_stack_000000b4;
  void *in_stack_000000b8;
  ALCdevice *in_stack_000000c0;
  byte local_82;
  bool local_81;
  atomic<bool> *in_stack_ffffffffffffff88;
  size_type local_70;
  atomic<bool> *local_68;
  undefined1 local_50 [76];
  int local_4;
  
  sio_initpar(local_50);
  iVar2 = sio_getpar(*(undefined8 *)(in_RDI + 0x10),local_50);
  if (iVar2 == 0) {
    ALCdevice::handleDisconnect(*(ALCdevice **)(in_RDI + 8),"Failed to get device parameters");
    local_4 = 1;
  }
  else {
    SetRTPriority();
    althrd_setname("alsoft-mixer");
LAB_0023d22b:
    bVar1 = std::atomic<bool>::load(in_stack_ffffffffffffff88,(memory_order)((ulong)in_RDI >> 0x20))
    ;
    local_81 = false;
    if (!bVar1) {
      local_81 = std::atomic<bool>::load
                           (in_stack_ffffffffffffff88,(memory_order)((ulong)in_RDI >> 0x20));
    }
    if (local_81 != false) {
      local_68 = (atomic<bool> *)
                 std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::data
                           ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)0x23d281);
      local_70 = std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::size
                           ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)(in_RDI + 0x18));
      ALCdevice::renderSamples
                (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000a8);
      while( true ) {
        local_82 = 0;
        if (local_70 != 0) {
          bVar1 = std::atomic<bool>::load
                            (in_stack_ffffffffffffff88,(memory_order)((ulong)in_RDI >> 0x20));
          local_82 = bVar1 ^ 0xff;
        }
        if ((local_82 & 1) == 0) goto LAB_0023d22b;
        in_stack_ffffffffffffff88 =
             (atomic<bool> *)sio_write(*(undefined8 *)(in_RDI + 0x10),local_68,local_70);
        if (in_stack_ffffffffffffff88 == (atomic<bool> *)0x0) break;
        local_70 = local_70 - (long)in_stack_ffffffffffffff88;
        local_68 = in_stack_ffffffffffffff88 + (long)local_68;
      }
      if (0 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) sio_write failed\n");
      }
      ALCdevice::handleDisconnect(*(ALCdevice **)(in_RDI + 8),"Failed to write playback samples");
      goto LAB_0023d22b;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SndioPlayback::mixerProc()
{
    sio_par par;
    sio_initpar(&par);
    if(!sio_getpar(mSndHandle, &par))
    {
        mDevice->handleDisconnect("Failed to get device parameters");
        return 1;
    }

    const size_t frameStep{par.pchan};
    const size_t frameSize{frameStep * par.bps};

    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    while(!mKillNow.load(std::memory_order_acquire)
        && mDevice->Connected.load(std::memory_order_acquire))
    {
        al::byte *WritePtr{mBuffer.data()};
        size_t len{mBuffer.size()};

        mDevice->renderSamples(WritePtr, static_cast<ALuint>(len)/frameSize, frameStep);
        while(len > 0 && !mKillNow.load(std::memory_order_acquire))
        {
            size_t wrote{sio_write(mSndHandle, WritePtr, len)};
            if(wrote == 0)
            {
                ERR("sio_write failed\n");
                mDevice->handleDisconnect("Failed to write playback samples");
                break;
            }

            len -= wrote;
            WritePtr += wrote;
        }
    }

    return 0;
}